

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O1

bool P_LoadGLNodes(MapData *map)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int wadnum;
  int iVar6;
  uint uVar7;
  FILE *__stream;
  size_t sVar8;
  FileReader *pFVar9;
  char *pcVar10;
  FWadLump *pFVar11;
  FResourceFile *pFVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long *plVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 uVar14;
  void *__ptr;
  uint *puVar15;
  long lVar16;
  uint i;
  char (*__s2) [9];
  uint uVar17;
  char hdata [8];
  uint unaff_R12D;
  uint uVar18;
  byte bVar19;
  long lVar20;
  FResourceFile *pFVar21;
  undefined1 auVar22 [16];
  char magic [4];
  FString path;
  BYTE md5map [16];
  BYTE md5 [16];
  int id;
  undefined4 local_1a0;
  char local_199;
  undefined1 local_198 [17];
  char cStack_187;
  char cStack_186;
  char cStack_185;
  char cStack_184;
  char cStack_183;
  char cStack_182;
  char cStack_181;
  char cStack_180;
  char cStack_17f;
  char cStack_17e;
  char cStack_17d;
  char cStack_17c;
  char cStack_17b;
  char cStack_17a;
  char cStack_179;
  int local_170;
  uint local_16c;
  MapLump local_168;
  MapLump local_158;
  FileReader *local_140;
  MemoryReader local_138 [4];
  
  pFVar9 = map->MapLumps[6].Reader;
  local_198._8_8_ = map;
  if ((pFVar9 != (FileReader *)0x0) && (pFVar9->Length != 0)) {
    map->file = pFVar9;
    (*(pFVar9->super_FileReaderBase)._vptr_FileReaderBase[4])(pFVar9,0,0);
    (*(map->file->super_FileReaderBase)._vptr_FileReaderBase[2])(map->file,local_138,4);
    if ((int)(DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase <
        0x334c475a) {
      if ((((DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase ==
            0x324c4758) ||
          ((DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase ==
           0x324c475a)) ||
         ((DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase ==
          0x334c4758)) {
LAB_003f89ff:
        subsectors = (subsector_t *)0x0;
        segs = (seg_t *)0x0;
        nodes = (node_t *)0x0;
        P_LoadZNodes(map->file,
                     (DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase)
        ;
        return true;
      }
    }
    else if ((((DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase ==
               0x334c475a) ||
             ((DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase ==
              0x4e4c475a)) ||
            ((DWORD)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase ==
             0x4e4c4758)) goto LAB_003f89ff;
  }
  local_1a0 = 0;
  CreateCacheName((MapData *)local_198,SUB81(map,0));
  __stream = fopen((char *)local_198._0_8_,"rb");
  if (__stream != (FILE *)0x0) {
    sVar8 = fread(&local_1a0,1,4,__stream);
    __ptr = (void *)0x0;
    if ((sVar8 == 4) && (local_1a0 == 0x48434143)) {
      sVar8 = fread(&local_16c,4,1,__stream);
      if (sVar8 == 1) {
        unaff_R12D = 0x17f2d48;
        if ((local_16c == numlines) && (sVar8 = fread(&local_168,1,0x10,__stream), sVar8 == 0x10)) {
          MapData::GetChecksum((MapData *)local_198._8_8_,local_198 + 0x10);
          auVar22[0] = -(local_168.Name[0] == local_198[0x10]);
          auVar22[1] = -(local_168.Name[1] == cStack_187);
          auVar22[2] = -(local_168.Name[2] == cStack_186);
          auVar22[3] = -(local_168.Name[3] == cStack_185);
          auVar22[4] = -(local_168.Name[4] == cStack_184);
          auVar22[5] = -(local_168.Name[5] == cStack_183);
          auVar22[6] = -(local_168.Name[6] == cStack_182);
          auVar22[7] = -(local_168.Name[7] == cStack_181);
          auVar22[8] = -((char)local_168.Reader == cStack_180);
          auVar22[9] = -(local_168.Reader._1_1_ == cStack_17f);
          auVar22[10] = -(local_168.Reader._2_1_ == cStack_17e);
          auVar22[0xb] = -(local_168.Reader._3_1_ == cStack_17d);
          auVar22[0xc] = -(local_168.Reader._4_1_ == cStack_17c);
          auVar22[0xd] = -(local_168.Reader._5_1_ == cStack_17b);
          auVar22[0xe] = -(local_168.Reader._6_1_ == cStack_17a);
          auVar22[0xf] = -(local_168.Reader._7_1_ == cStack_179);
          if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar22[0xf] >> 7) << 0xf) == 0xffff) {
            __ptr = operator_new__((ulong)(local_16c * 8) << 2);
            sVar8 = fread(__ptr,8,(ulong)local_16c,__stream);
            if (((sVar8 == local_16c) && (sVar8 = fread(&local_1a0,1,4,__stream), sVar8 == 4)) &&
               ((local_1a0 & 0xfeffffff) == 0x324c475a)) {
              lVar20 = ftell(__stream);
              FileReader::FileReader(&local_138[0].super_FileReader,(FILE *)__stream);
              FileReader::Seek(&local_138[0].super_FileReader,lVar20,0);
              P_LoadZNodes(&local_138[0].super_FileReader,
                           local_1a0 & 0xff000000 | (int)local_1a0._2_1_ << 0x10 |
                           (int)local_1a0._1_1_ << 8 | (int)(char)local_1a0);
              MemoryReader::~MemoryReader(local_138);
              lVar20 = (long)numlines;
              if (0 < lVar20) {
                puVar15 = (uint *)((long)__ptr + 4);
                lVar16 = 0;
                do {
                  *(vertex_t **)(lines->args + lVar16 * 2 + -0xb) = vertexes + puVar15[-1];
                  *(vertex_t **)(lines->args + lVar16 * 2 + -9) = vertexes + *puVar15;
                  lVar16 = lVar16 + 0x13;
                  puVar15 = puVar15 + 2;
                } while (lVar20 * 0x13 != lVar16);
              }
              operator_delete__(__ptr);
              fclose(__stream);
              FString::~FString((FString *)local_198);
              return true;
            }
            goto LAB_003f8b29;
          }
        }
      }
      __ptr = (void *)0x0;
    }
LAB_003f8b29:
    if (__ptr != (void *)0x0) {
      operator_delete__(__ptr);
    }
    fclose(__stream);
    map = (MapData *)local_198._8_8_;
  }
  FString::~FString((FString *)local_198);
  local_158.Name[0] = '\0';
  local_158.Name[1] = '\0';
  local_158.Name[2] = '\0';
  local_158.Name[3] = '\0';
  local_158.Name[4] = '\0';
  local_158.Name[5] = '\0';
  local_158.Name[6] = '\0';
  local_158.Name[7] = '\0';
  local_158.Reader = (FileReader *)0x0;
  local_168.Name[0] = '\0';
  local_168.Name[1] = '\0';
  local_168.Name[2] = '\0';
  local_168.Name[3] = '\0';
  local_168.Name[4] = '\0';
  local_168.Name[5] = '\0';
  local_168.Name[6] = '\0';
  local_168.Name[7] = '\0';
  local_168.Reader = (FileReader *)0x0;
  iVar5 = FWadCollection::GetLumpFile(&Wads,map->lumpnum);
  bVar3 = map->InWad;
  pFVar21 = map->resource;
  pFVar9 = (FileReader *)FWadCollection::GetWadFullName(&Wads,iVar5);
  if (bVar3 == true) {
    iVar5 = map->lumpnum;
    local_140 = pFVar9;
    wadnum = FWadCollection::GetLumpFile(&Wads,iVar5);
    local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase = (_func_int **)0x727dbc
    ;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    pcVar10 = FWadCollection::GetLumpFullName(&Wads,iVar5);
    FString::Format((FString *)local_138,"GL_%s",pcVar10);
    if (*(uint *)((long)local_138[0].super_FileReader.super_FileReaderBase._vptr_FileReaderBase +
                 -0xc) < 9) {
      unaff_R12D = FWadCollection::CheckNumForName
                             (&Wads,(char *)local_138[0].super_FileReader.super_FileReaderBase.
                                            _vptr_FileReaderBase,0,wadnum,true);
      if ((int)unaff_R12D < 0) {
LAB_003f8cde:
        unaff_R12D = 0xffffffff;
      }
    }
    else {
      iVar6 = FWadCollection::CheckNumForName(&Wads,"GL_LEVEL",0,wadnum,true);
      if (iVar6 < 0) {
        bVar19 = 1;
      }
      else {
        local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
        local_170 = iVar5;
        do {
          do {
            uVar7 = FWadCollection::FindLump(&Wads,"GL_LEVEL",(int *)local_198,false);
            uVar18 = unaff_R12D;
            if ((int)uVar7 < 0) goto LAB_003f8cd0;
            iVar5 = FWadCollection::GetLumpFile(&Wads,uVar7);
          } while (iVar5 != wadnum);
          FWadCollection::ReadLump((FWadCollection *)(local_198 + 0x10),0x1c74350);
          pcVar10 = FWadCollection::GetLumpFullName(&Wads,local_170);
          hdata[0] = '\0';
          hdata[1] = '\0';
          hdata[2] = '\0';
          hdata[3] = '\0';
          hdata[4] = '\0';
          hdata[5] = '\0';
          hdata[6] = '\0';
          hdata[7] = '\0';
          if (*(int *)((long)stack0xfffffffffffffe78 + -0xc) != 0) {
            hdata = stack0xfffffffffffffe78;
          }
          local_199 = MatchHeader(pcVar10,(char *)hdata);
          FMemLump::~FMemLump((FMemLump *)(local_198 + 0x10));
          uVar18 = uVar7;
        } while (local_199 == '\0');
LAB_003f8cd0:
        bVar19 = (byte)(uVar7 >> 0x1f);
        unaff_R12D = uVar18;
      }
      if (bVar19 != 0) goto LAB_003f8cde;
    }
    FString::~FString((FString *)local_138);
    if (-1 < (int)unaff_R12D) {
      lVar20 = 0;
      do {
        pFVar11 = FWadCollection::ReopenLumpNum(&Wads,unaff_R12D + 1 + (int)lVar20);
        *(FWadLump **)(local_168.Name + lVar20 * 8) = pFVar11;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 4);
      bVar3 = DoLoadGLNodes((FileReader **)&local_168);
      return bVar3;
    }
    strcpy((char *)local_138,(char *)local_140);
    pcVar10 = strrchr((char *)local_138,0x2e);
    bVar3 = true;
    if (pcVar10 != (char *)0x0) {
      builtin_strncpy(pcVar10,".gwa",5);
      pFVar21 = (FResourceFile *)0x0;
      pFVar12 = FResourceFile::OpenResourceFile((char *)local_138,(FileReader *)0x0,true,false);
      uVar14 = local_198._8_8_;
      if (pFVar12 == (FResourceFile *)0x0) {
        bVar3 = false;
      }
      else {
        pcVar10 = FWadCollection::GetLumpFullName(&Wads,*(int *)(local_198._8_8_ + 0xd4));
        strncpy((char *)uVar14,pcVar10,8);
        pFVar21 = pFVar12;
      }
    }
    if (!bVar3) {
      return false;
    }
  }
  if (pFVar21 == (FResourceFile *)0x0) {
    uVar18 = 0xffffffff;
    goto LAB_003f8ec4;
  }
  local_198[0] = -0x44;
  local_198[1] = '}';
  local_198[2] = 'r';
  local_198[3] = '\0';
  local_198[4] = '\0';
  local_198[5] = '\0';
  local_198[6] = '\0';
  local_198[7] = '\0';
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  uVar7 = pFVar21->NumLumps;
  FString::Format((FString *)local_198,"GL_%.8s",local_198._8_8_);
  uVar2 = *(uint *)(local_198._0_8_ + -0xc);
  if (8 < uVar2) {
    FString::operator=((FString *)local_198,"GL_LEVEL");
  }
  if (uVar7 < 5) {
LAB_003f8eb4:
    uVar18 = 0xffffffff;
  }
  else {
    bVar3 = uVar7 != 4;
    uVar18 = unaff_R12D;
    if (bVar3) {
      uVar17 = 0;
      do {
        iVar5 = (*pFVar21->_vptr_FResourceFile[4])(pFVar21,(ulong)uVar17);
        iVar5 = strncasecmp((char *)(CONCAT44(extraout_var,iVar5) + 0x18),(char *)local_198._0_8_,8)
        ;
        if (iVar5 == 0) {
          uVar18 = uVar17;
          if (uVar2 < 9) break;
          local_198[0x10] = '\0';
          cStack_187 = '\0';
          cStack_186 = '\0';
          cStack_185 = '\0';
          cStack_184 = '\0';
          cStack_183 = '\0';
          cStack_182 = '\0';
          cStack_181 = '\0';
          _cStack_180 = (FileReader *)0x0;
          iVar5 = (*pFVar21->_vptr_FResourceFile[4])(pFVar21,(ulong)uVar17);
          plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x10))
                                      ((long *)CONCAT44(extraout_var_00,iVar5));
          (**(code **)(*plVar13 + 0x10))(plVar13,local_198 + 0x10,0x10);
          bVar4 = MatchHeader((char *)local_198._8_8_,local_198 + 0x10);
          if (bVar4) break;
        }
        uVar17 = uVar17 + 1;
        bVar3 = uVar17 < uVar7 - 4;
        uVar18 = unaff_R12D;
      } while (uVar17 != uVar7 - 4);
    }
    if (!bVar3) goto LAB_003f8eb4;
  }
  FString::~FString((FString *)local_198);
LAB_003f8ec4:
  if (uVar18 == 0xffffffff) {
    bVar3 = false;
  }
  else {
    __s2 = P_LoadGLNodes::check;
    lVar20 = 0;
    do {
      uVar1 = (ulong)(uVar18 + 1) + lVar20;
      iVar5 = (*pFVar21->_vptr_FResourceFile[4])(pFVar21,uVar1 & 0xffffffff);
      iVar5 = strncasecmp((char *)(CONCAT44(extraout_var_01,iVar5) + 0x18),*__s2,8);
      if (iVar5 != 0) {
        bVar3 = false;
        goto LAB_003f8f30;
      }
      iVar5 = (*pFVar21->_vptr_FResourceFile[4])(pFVar21,uVar1 & 0xffffffff);
      uVar14 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x18))
                         ((long *)CONCAT44(extraout_var_02,iVar5));
      *(undefined8 *)(local_168.Name + lVar20 * 8) = uVar14;
      lVar20 = lVar20 + 1;
      __s2 = __s2 + 1;
    } while (lVar20 != 4);
    bVar3 = true;
LAB_003f8f30:
    if (bVar3 != false) {
      bVar3 = DoLoadGLNodes((FileReader **)&local_168);
    }
  }
  if ((pFVar21 != (FResourceFile *)0x0) && (pFVar21 != *(FResourceFile **)(local_198._8_8_ + 0xe0)))
  {
    (*pFVar21->_vptr_FResourceFile[1])(pFVar21);
  }
  lVar20 = 0;
  do {
    if (*(long **)(local_168.Name + lVar20 * 8) != (long *)0x0) {
      (**(code **)(**(long **)(local_168.Name + lVar20 * 8) + 8))();
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 4);
  return bVar3;
}

Assistant:

bool P_LoadGLNodes(MapData * map)
{
	if (map->MapLumps[ML_GLZNODES].Reader && map->MapLumps[ML_GLZNODES].Reader->GetLength() != 0)
	{
		const int idcheck1a = MAKE_ID('Z','G','L','N');
		const int idcheck2a = MAKE_ID('Z','G','L','2');
		const int idcheck3a = MAKE_ID('Z','G','L','3');
		const int idcheck1b = MAKE_ID('X','G','L','N');
		const int idcheck2b = MAKE_ID('X','G','L','2');
		const int idcheck3b = MAKE_ID('X','G','L','3');
		int id;

		map->Seek(ML_GLZNODES);
		map->file->Read (&id, 4);
		if (id == idcheck1a || id == idcheck2a || id == idcheck3a ||
			id == idcheck1b || id == idcheck2b || id == idcheck3b)
		{
			try
			{
				subsectors = NULL;
				segs = NULL;
				nodes = NULL;
				P_LoadZNodes (*map->file, id);
				return true;
			}
			catch (CRecoverableError &)
			{
				if (subsectors != NULL)
				{
					delete[] subsectors;
					subsectors = NULL;
				}
				if (segs != NULL)
				{
					delete[] segs;
					segs = NULL;
				}
				if (nodes != NULL)
				{
					delete[] nodes;
					nodes = NULL;
				}
			}
		}
	}

	if (!CheckCachedNodes(map))
	{
		FileReader *gwalumps[4] = { NULL, NULL, NULL, NULL };
		char path[256];
		int li;
		int lumpfile = Wads.GetLumpFile(map->lumpnum);
		bool mapinwad = map->InWad;
		FResourceFile * f_gwa = map->resource;

		const char * name = Wads.GetWadFullName(lumpfile);

		if (mapinwad)
		{
			li = FindGLNodesInWAD(map->lumpnum);

			if (li>=0)
			{
				// GL nodes are loaded with a WAD
				for(int i=0;i<4;i++)
				{
					gwalumps[i]=Wads.ReopenLumpNum(li+i+1);
				}
				return DoLoadGLNodes(gwalumps);
			}
			else
			{
				strcpy(path, name);

				char * ext = strrchr(path, '.');
				if (ext)
				{
					strcpy(ext, ".gwa");
					// Todo: Compare file dates

					f_gwa = FResourceFile::OpenResourceFile(path, NULL, true);
					if (f_gwa==NULL) return false;

					strncpy(map->MapLumps[0].Name, Wads.GetLumpFullName(map->lumpnum), 8);
				}
			}
		}

		bool result = false;
		li = FindGLNodesInFile(f_gwa, map->MapLumps[0].Name);
		if (li!=-1)
		{
			static const char check[][9]={"GL_VERT","GL_SEGS","GL_SSECT","GL_NODES"};
			result=true;
			for(unsigned i=0; i<4;i++)
			{
				if (strnicmp(f_gwa->GetLump(li+i+1)->Name, check[i], 8))
				{
					result=false;
					break;
				}
				else
					gwalumps[i] = f_gwa->GetLump(li+i+1)->NewReader();
			}
			if (result) result = DoLoadGLNodes(gwalumps);
		}

		if (f_gwa != map->resource)
			delete f_gwa;
		for(unsigned int i = 0;i < 4;++i)
			delete gwalumps[i];
		return result;
	}
	else return true;
}